

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testStandardAttributes.cpp
# Opt level: O0

void anon_unknown.dwarf_1dc86c::rationalMethods(void)

{
  bool bVar1;
  ostream *this;
  double dVar2;
  Rational r11;
  Rational r10;
  Rational r9;
  Rational r8;
  Rational r7;
  Rational r6;
  Rational r5;
  Rational r4;
  Rational r3;
  Rational r2;
  Rational r1;
  Rational r0;
  undefined4 in_stack_fffffffffffffee8;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  Rational local_110;
  Rational local_108;
  Rational local_100;
  Rational in_stack_ffffffffffffff08;
  Rational in_stack_ffffffffffffff10;
  Rational local_e8;
  Rational local_e0;
  Rational local_d8;
  Rational local_d0;
  Rational local_c8;
  Rational local_c0;
  Rational local_b8;
  Rational local_b0;
  Rational local_a8;
  Rational local_a0;
  Rational local_98;
  Rational local_90;
  Rational local_88;
  Rational local_80;
  Rational local_78;
  Rational local_70;
  Rational local_68;
  Rational local_60;
  Rational local_58;
  Rational local_50;
  Rational local_48;
  Rational local_40;
  Rational local_38;
  Rational local_30;
  Rational local_28;
  Rational local_20;
  Rational local_18;
  Rational local_10;
  Rational local_8;
  
  this = std::operator<<((ostream *)&std::cout,"rational methods");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Imf_2_5::Rational::Rational(&local_8,0,1);
  dVar2 = Imf_2_5::Rational::operator_cast_to_double(&local_8);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    __assert_fail("r0 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x2fd,"void (anonymous namespace)::rationalMethods()");
  }
  Imf_2_5::Rational::Rational(&local_10,1,1);
  dVar2 = Imf_2_5::Rational::operator_cast_to_double(&local_10);
  if ((dVar2 != 1.0) || (NAN(dVar2))) {
    __assert_fail("r1 == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x300,"void (anonymous namespace)::rationalMethods()");
  }
  Imf_2_5::Rational::Rational(&local_18,1,4);
  dVar2 = Imf_2_5::Rational::operator_cast_to_double(&local_18);
  if ((dVar2 != 0.25) || (NAN(dVar2))) {
    __assert_fail("r2 == 0.25",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x303,"void (anonymous namespace)::rationalMethods()");
  }
  Imf_2_5::Rational::Rational(&local_20,-8,2);
  dVar2 = Imf_2_5::Rational::operator_cast_to_double(&local_20);
  if ((dVar2 != -4.0) || (NAN(dVar2))) {
    __assert_fail("r3 == -4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x306,"void (anonymous namespace)::rationalMethods()");
  }
  Imf_2_5::Rational::Rational
            ((Rational *)in_stack_ffffffffffffff10,(double)in_stack_ffffffffffffff08);
  dVar2 = Imf_2_5::Rational::operator_cast_to_double(&local_28);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    __assert_fail("r4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x309,"void (anonymous namespace)::rationalMethods()");
  }
  Imf_2_5::Rational::Rational
            ((Rational *)in_stack_ffffffffffffff10,(double)in_stack_ffffffffffffff08);
  dVar2 = Imf_2_5::Rational::operator_cast_to_double(&local_30);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    __assert_fail("r5 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x30c,"void (anonymous namespace)::rationalMethods()");
  }
  Imf_2_5::Rational::Rational
            ((Rational *)in_stack_ffffffffffffff10,(double)in_stack_ffffffffffffff08);
  dVar2 = Imf_2_5::Rational::operator_cast_to_double(&local_38);
  uVar6 = false;
  if (((dVar2 == 1.0) && (!NAN(dVar2))) && (uVar6 = false, local_38.n == 1)) {
    uVar6 = local_38.d == 1;
  }
  if ((bool)uVar6 == false) {
    __assert_fail("r6 == 1.0 && r6.n == 1 && r6.d == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x30f,"void (anonymous namespace)::rationalMethods()");
  }
  Imf_2_5::Rational::Rational
            ((Rational *)in_stack_ffffffffffffff10,(double)in_stack_ffffffffffffff08);
  dVar2 = Imf_2_5::Rational::operator_cast_to_double(&local_40);
  uVar5 = false;
  if (((dVar2 == -10.0) && (!NAN(dVar2))) && (uVar5 = false, local_40.n == -10)) {
    uVar5 = local_40.d == 1;
  }
  if ((bool)uVar5 == false) {
    __assert_fail("r7 == -10.0 && r7.n == -10 && r7.d == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x312,"void (anonymous namespace)::rationalMethods()");
  }
  Imf_2_5::Rational::Rational
            ((Rational *)in_stack_ffffffffffffff10,(double)in_stack_ffffffffffffff08);
  dVar2 = Imf_2_5::Rational::operator_cast_to_double(&local_48);
  uVar4 = false;
  if (((dVar2 == 0.03125) && (!NAN(dVar2))) && (uVar4 = false, local_48.n == 1)) {
    uVar4 = local_48.d == 0x20;
  }
  if ((bool)uVar4 == false) {
    __assert_fail("r8 == 0.03125 && r8.n == 1 && r8.d == 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x315,"void (anonymous namespace)::rationalMethods()");
  }
  Imf_2_5::Rational::Rational
            ((Rational *)in_stack_ffffffffffffff10,(double)in_stack_ffffffffffffff08);
  dVar2 = Imf_2_5::Rational::operator_cast_to_double(&local_50);
  uVar3 = false;
  if (((dVar2 == 0.53125) && (!NAN(dVar2))) && (uVar3 = false, local_50.n == 0x11)) {
    uVar3 = local_50.d == 0x20;
  }
  if ((bool)uVar3 == false) {
    __assert_fail("r9 == 0.53125 && r9.n == 17 && r9.d == 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x318,"void (anonymous namespace)::rationalMethods()");
  }
  Imf_2_5::Rational::Rational
            ((Rational *)in_stack_ffffffffffffff10,(double)in_stack_ffffffffffffff08);
  dVar2 = Imf_2_5::Rational::operator_cast_to_double(&local_58);
  bVar1 = Imath_2_5::equalWithAbsError<double>(dVar2,10.1,1e-08);
  if (!bVar1) {
    __assert_fail("equalWithAbsError (double (r10), 10.1, 1e-8)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x31b,"void (anonymous namespace)::rationalMethods()");
  }
  Imf_2_5::Rational::Rational
            ((Rational *)in_stack_ffffffffffffff10,(double)in_stack_ffffffffffffff08);
  dVar2 = Imf_2_5::Rational::operator_cast_to_double(&local_60);
  if ((dVar2 != 1073741823.0) || (NAN(dVar2))) {
    __assert_fail("r11 == double ((1U << 30) - 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x31e,"void (anonymous namespace)::rationalMethods()");
  }
  local_68 = Imf_2_5::guessExactFps
                       ((double)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,
                                                  in_stack_fffffffffffffee8)))));
  local_70 = Imf_2_5::fps_23_976();
  bVar1 = equal(&local_68,&local_70);
  if (!bVar1) {
    __assert_fail("equal (guessExactFps (23.976), fps_23_976())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,800,"void (anonymous namespace)::rationalMethods()");
  }
  local_78 = Imf_2_5::guessExactFps
                       ((double)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,
                                                  in_stack_fffffffffffffee8)))));
  local_80 = Imf_2_5::fps_24();
  bVar1 = equal(&local_78,&local_80);
  if (!bVar1) {
    __assert_fail("equal (guessExactFps (24.000), fps_24())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x321,"void (anonymous namespace)::rationalMethods()");
  }
  local_88 = Imf_2_5::guessExactFps
                       ((double)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,
                                                  in_stack_fffffffffffffee8)))));
  local_90 = Imf_2_5::fps_25();
  bVar1 = equal(&local_88,&local_90);
  if (!bVar1) {
    __assert_fail("equal (guessExactFps (25.000), fps_25())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x322,"void (anonymous namespace)::rationalMethods()");
  }
  local_98 = Imf_2_5::guessExactFps
                       ((double)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,
                                                  in_stack_fffffffffffffee8)))));
  local_a0 = Imf_2_5::fps_29_97();
  bVar1 = equal(&local_98,&local_a0);
  if (!bVar1) {
    __assert_fail("equal (guessExactFps (29.970), fps_29_97())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x323,"void (anonymous namespace)::rationalMethods()");
  }
  local_a8 = Imf_2_5::guessExactFps
                       ((double)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,
                                                  in_stack_fffffffffffffee8)))));
  local_b0 = Imf_2_5::fps_30();
  bVar1 = equal(&local_a8,&local_b0);
  if (!bVar1) {
    __assert_fail("equal (guessExactFps (30.000), fps_30())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x324,"void (anonymous namespace)::rationalMethods()");
  }
  local_b8 = Imf_2_5::guessExactFps
                       ((double)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,
                                                  in_stack_fffffffffffffee8)))));
  local_c0 = Imf_2_5::fps_47_952();
  bVar1 = equal(&local_b8,&local_c0);
  if (!bVar1) {
    __assert_fail("equal (guessExactFps (47.952), fps_47_952())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x325,"void (anonymous namespace)::rationalMethods()");
  }
  local_c8 = Imf_2_5::guessExactFps
                       ((double)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,
                                                  in_stack_fffffffffffffee8)))));
  local_d0 = Imf_2_5::fps_48();
  bVar1 = equal(&local_c8,&local_d0);
  if (!bVar1) {
    __assert_fail("equal (guessExactFps (48.000), fps_48())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x326,"void (anonymous namespace)::rationalMethods()");
  }
  local_d8 = Imf_2_5::guessExactFps
                       ((double)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,
                                                  in_stack_fffffffffffffee8)))));
  local_e0 = Imf_2_5::fps_50();
  bVar1 = equal(&local_d8,&local_e0);
  if (!bVar1) {
    __assert_fail("equal (guessExactFps (50.000), fps_50())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x327,"void (anonymous namespace)::rationalMethods()");
  }
  local_e8 = Imf_2_5::guessExactFps
                       ((double)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,
                                                  in_stack_fffffffffffffee8)))));
  Imf_2_5::fps_59_94();
  bVar1 = equal(&local_e8,(Rational *)&stack0xffffffffffffff10);
  if (!bVar1) {
    __assert_fail("equal (guessExactFps (59.940), fps_59_94())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x328,"void (anonymous namespace)::rationalMethods()");
  }
  Imf_2_5::guessExactFps
            ((double)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,
                                                  in_stack_fffffffffffffee8)))));
  local_100 = Imf_2_5::fps_60();
  bVar1 = equal((Rational *)&stack0xffffffffffffff08,&local_100);
  if (!bVar1) {
    __assert_fail("equal (guessExactFps (60.000), fps_60())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x329,"void (anonymous namespace)::rationalMethods()");
  }
  local_108 = Imf_2_5::guessExactFps
                        ((double)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,
                                                  in_stack_fffffffffffffee8)))));
  Imf_2_5::Rational::Rational(&local_110,0x8d,2);
  bVar1 = equal(&local_108,&local_110);
  if (!bVar1) {
    __assert_fail("equal (guessExactFps (70.500), Rational (141, 2))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testStandardAttributes.cpp"
                  ,0x32a,"void (anonymous namespace)::rationalMethods()");
  }
  return;
}

Assistant:

void
rationalMethods ()
{
    cout << "rational methods" << endl;

    Rational r0 (0, 1);
    assert (r0 == 0);

    Rational r1 (1, 1);
    assert (r1 == 1);

    Rational r2 (1, 4);
    assert (r2 == 0.25);

    Rational r3 (-8, 2);
    assert (r3 == -4);

    Rational r4 (0.0);
    assert (r4 == 0);

    Rational r5 (1e-50);
    assert (r5 == 0);

    Rational r6 (1.0);
    assert (r6 == 1.0 && r6.n == 1 && r6.d == 1);

    Rational r7 (-10.0);
    assert (r7 == -10.0 && r7.n == -10 && r7.d == 1);

    Rational r8 (0.03125);
    assert (r8 == 0.03125 && r8.n == 1 && r8.d == 32);

    Rational r9 (0.53125);
    assert (r9 == 0.53125 && r9.n == 17 && r9.d == 32);

    Rational r10 (10.1);
    assert (equalWithAbsError (double (r10), 10.1, 1e-8));

    Rational r11 (double ((1U << 30) - 1));
    assert (r11 == double ((1U << 30) - 1));

    assert (equal (guessExactFps (23.976), fps_23_976()));
    assert (equal (guessExactFps (24.000), fps_24()));
    assert (equal (guessExactFps (25.000), fps_25()));
    assert (equal (guessExactFps (29.970), fps_29_97()));
    assert (equal (guessExactFps (30.000), fps_30()));
    assert (equal (guessExactFps (47.952), fps_47_952()));
    assert (equal (guessExactFps (48.000), fps_48()));
    assert (equal (guessExactFps (50.000), fps_50()));
    assert (equal (guessExactFps (59.940), fps_59_94()));
    assert (equal (guessExactFps (60.000), fps_60()));
    assert (equal (guessExactFps (70.500), Rational (141, 2)));
}